

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pair1_poly_test.c
# Opt level: O3

void test_poly_best_effort(void)

{
  nng_err nVar1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  nng_msg *local_40;
  nng_msg *msg;
  nng_socket c1;
  nng_socket s1;
  
  nVar1 = nng_pair1_open_poly((nng_socket *)((long)&msg + 4));
  pcVar4 = nng_strerror(nVar1);
  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/pair1/pair1_poly_test.c"
                         ,0x2e,"%s: expected success, got %s (%d)","nng_pair1_open_poly(&s1)",pcVar4
                         ,nVar1);
  if (iVar2 != 0) {
    nVar1 = nng_pair1_open((nng_socket *)&msg);
    pcVar4 = nng_strerror(nVar1);
    iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                           "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/pair1/pair1_poly_test.c"
                           ,0x2f,"%s: expected success, got %s (%d)","nng_pair1_open(&c1)",pcVar4,
                           nVar1);
    if (iVar2 != 0) {
      nVar1 = nng_socket_set_int(msg._4_4_,"recv-buffer",1);
      pcVar4 = nng_strerror(nVar1);
      iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                             "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/pair1/pair1_poly_test.c"
                             ,0x31,"%s: expected success, got %s (%d)",
                             "nng_socket_set_int(s1, NNG_OPT_RECVBUF, 1)",pcVar4,nVar1);
      if (iVar2 != 0) {
        nVar1 = nng_socket_set_int(msg._4_4_,"send-buffer",1);
        pcVar4 = nng_strerror(nVar1);
        iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                               "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/pair1/pair1_poly_test.c"
                               ,0x32,"%s: expected success, got %s (%d)",
                               "nng_socket_set_int(s1, NNG_OPT_SENDBUF, 1)",pcVar4,nVar1);
        if (iVar2 != 0) {
          nVar1 = nng_socket_set_int(msg._0_4_,"recv-buffer",1);
          pcVar4 = nng_strerror(nVar1);
          iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                                 "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/pair1/pair1_poly_test.c"
                                 ,0x33,"%s: expected success, got %s (%d)",
                                 "nng_socket_set_int(c1, NNG_OPT_RECVBUF, 1)",pcVar4,nVar1);
          if (iVar2 != 0) {
            nVar1 = nng_socket_set_ms(msg._4_4_,"send-timeout",1000);
            pcVar4 = nng_strerror(nVar1);
            iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                                   "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/pair1/pair1_poly_test.c"
                                   ,0x34,"%s: expected success, got %s (%d)",
                                   "nng_socket_set_ms(s1, NNG_OPT_SENDTIMEO, SECOND)",pcVar4,nVar1);
            if (iVar2 != 0) {
              nVar1 = nuts_marry(msg._4_4_,msg._0_4_);
              pcVar4 = nng_strerror(nVar1);
              iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                                     "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/pair1/pair1_poly_test.c"
                                     ,0x36,"%s: expected success, got %s (%d)","nuts_marry(s1, c1)",
                                     pcVar4,nVar1);
              if (iVar2 != 0) {
                iVar2 = 10;
                do {
                  nVar1 = nng_msg_alloc(&local_40,0);
                  pcVar4 = nng_strerror(nVar1);
                  iVar3 = acutest_check_((uint)(nVar1 == NNG_OK),
                                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/pair1/pair1_poly_test.c"
                                         ,0x39,"%s: expected success, got %s (%d)",
                                         "nng_msg_alloc(&msg, 0)",pcVar4,nVar1);
                  if (iVar3 == 0) goto LAB_0010bd05;
                  nVar1 = nng_sendmsg(msg._4_4_,local_40,0);
                  pcVar4 = nng_strerror(nVar1);
                  iVar3 = acutest_check_((uint)(nVar1 == NNG_OK),
                                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/pair1/pair1_poly_test.c"
                                         ,0x3a,"%s: expected success, got %s (%d)",
                                         "nng_sendmsg(s1, msg, 0)",pcVar4,nVar1);
                  if (iVar3 == 0) goto LAB_0010bd05;
                  iVar2 = iVar2 + -1;
                } while (iVar2 != 0);
                nVar1 = nng_socket_close(msg._4_4_);
                pcVar4 = nng_strerror(nVar1);
                iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                                       "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/pair1/pair1_poly_test.c"
                                       ,0x3d,"%s: expected success, got %s (%d)",
                                       "nng_socket_close(s1)",pcVar4,nVar1);
                if (iVar2 != 0) {
                  nVar1 = nng_socket_close(msg._0_4_);
                  pcVar4 = nng_strerror(nVar1);
                  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/pair1/pair1_poly_test.c"
                                         ,0x3e,"%s: expected success, got %s (%d)",
                                         "nng_socket_close(c1)",pcVar4,nVar1);
                  if (iVar2 != 0) {
                    return;
                  }
                }
              }
            }
          }
        }
      }
    }
  }
LAB_0010bd05:
  acutest_abort_();
}

Assistant:

void
test_poly_best_effort(void)
{
	nng_socket s1;
	nng_socket c1;
	nng_msg   *msg;

	NUTS_PASS(nng_pair1_open_poly(&s1));
	NUTS_PASS(nng_pair1_open(&c1));

	NUTS_PASS(nng_socket_set_int(s1, NNG_OPT_RECVBUF, 1));
	NUTS_PASS(nng_socket_set_int(s1, NNG_OPT_SENDBUF, 1));
	NUTS_PASS(nng_socket_set_int(c1, NNG_OPT_RECVBUF, 1));
	NUTS_PASS(nng_socket_set_ms(s1, NNG_OPT_SENDTIMEO, SECOND));

	NUTS_MARRY(s1, c1);

	for (int i = 0; i < 10; i++) {
		NUTS_PASS(nng_msg_alloc(&msg, 0));
		NUTS_PASS(nng_sendmsg(s1, msg, 0));
	}

	NUTS_CLOSE(s1);
	NUTS_CLOSE(c1);
}